

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void __thiscall FLinePortalTraverse::AddLineIntercepts(FLinePortalTraverse *this,int bx,int by)

{
  line_t_conflict *li;
  uint uVar1;
  int iVar2;
  int iVar3;
  FPortalBlock *pFVar4;
  line_t_conflict **pplVar5;
  undefined1 local_90 [8];
  intercept_t newintercept;
  DVector2 local_68;
  undefined1 local_58 [8];
  divline_t dl;
  double frac;
  line_t_conflict *ld;
  uint i;
  FPortalBlock *block;
  int by_local;
  int bx_local;
  FLinePortalTraverse *this_local;
  
  if ((((-1 < by) && (by < bmapheight)) && (-1 < bx)) && (bx < bmapwidth)) {
    pFVar4 = FPortalBlockmap::operator()(&PortalBlockmap,bx,by);
    for (ld._4_4_ = 0; uVar1 = TArray<line_t_*,_line_t_*>::Size(&pFVar4->portallines),
        ld._4_4_ < uVar1; ld._4_4_ = ld._4_4_ + 1) {
      pplVar5 = TArray<line_t_*,_line_t_*>::operator[](&pFVar4->portallines,(ulong)ld._4_4_);
      li = *pplVar5;
      if (li->validcount != validcount) {
        vertex_t::fPos((vertex_t *)&local_68);
        iVar2 = P_PointOnDivlineSide(&local_68,&(this->super_FPathTraverse).trace);
        vertex_t::fPos((vertex_t *)&newintercept.d);
        iVar3 = P_PointOnDivlineSide((DVector2 *)&newintercept.d,&(this->super_FPathTraverse).trace)
        ;
        if (iVar2 != iVar3) {
          P_MakeDivline((line_t *)li,(divline_t *)local_58);
          iVar2 = P_PointOnDivlineSide
                            ((this->super_FPathTraverse).trace.x,(this->super_FPathTraverse).trace.y
                             ,(divline_t *)local_58);
          if ((iVar2 == 0) &&
             (iVar2 = P_PointOnDivlineSide
                                ((this->super_FPathTraverse).trace.x +
                                 (this->super_FPathTraverse).trace.dx,
                                 (this->super_FPathTraverse).trace.y +
                                 (this->super_FPathTraverse).trace.dy,(divline_t *)local_58),
             iVar2 == 1)) {
            P_MakeDivline((line_t *)li,(divline_t *)local_58);
            dl.dy = P_InterceptVector(&(this->super_FPathTraverse).trace,(divline_t *)local_58);
            if ((0.0 <= dl.dy) && (dl.dy <= 1.0)) {
              newintercept.frac._0_1_ = 1;
              newintercept.frac._1_1_ = 0;
              local_90 = (undefined1  [8])dl.dy;
              newintercept._8_8_ = li;
              TArray<intercept_t,_intercept_t>::Push
                        (&FPathTraverse::intercepts,(intercept_t *)local_90);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FLinePortalTraverse::AddLineIntercepts(int bx, int by)
{
	if (by < 0 || by >= bmapheight || bx < 0 || bx >= bmapwidth) return;

	FPortalBlock &block = PortalBlockmap(bx, by);

	for (unsigned i = 0; i<block.portallines.Size(); i++)
	{
		line_t *ld = block.portallines[i];
		double frac;
		divline_t dl;

		if (ld->validcount == validcount) continue;	// already processed

		if (P_PointOnDivlineSide (ld->v1->fPos(), &trace) ==
			P_PointOnDivlineSide (ld->v2->fPos(), &trace))
		{
			continue;		// line isn't crossed
		}
		P_MakeDivline (ld, &dl);
		if (P_PointOnDivlineSide(trace.x, trace.y, &dl) != 0 ||
			P_PointOnDivlineSide(trace.x + trace.dx, trace.y + trace.dy, &dl) != 1)
		{
			continue;		// line isn't crossed from the front side
		}

		// hit the line
		P_MakeDivline(ld, &dl);
		frac = P_InterceptVector(&trace, &dl);
		if (frac < 0 || frac > 1.) continue;	// behind source

		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push(newintercept);
	}
}